

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O0

void windowRefreshFun(GLFWwindow *window)

{
  GLFWwindow *window_local;
  
  drawAllViews();
  glfwSwapBuffers(window);
  do_redraw = 0;
  return;
}

Assistant:

static void windowRefreshFun(GLFWwindow* window)
{
    drawAllViews();
    glfwSwapBuffers(window);
    do_redraw = 0;
}